

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O3

void av1_setup_frame(AV1_COMP *cpi)

{
  AV1_COMMON *cm;
  uint uVar1;
  SequenceHeader *pSVar2;
  byte bVar3;
  BLOCK_SIZE BVar4;
  long lVar5;
  RefCntBuffer *pRVar6;
  
  cm = &cpi->common;
  bVar3 = (cpi->common).current_frame.frame_type;
  if ((((bVar3 & 0xfd) == 0) || ((cpi->common).features.error_resilient_mode != false)) ||
     ((cpi->ext_flags).use_primary_ref_none == true)) {
    av1_setup_past_independence(cm);
    bVar3 = (cm->current_frame).frame_type;
  }
  if ((bVar3 == 3) || ((bVar3 == 0 && ((cpi->common).show_frame != 0)))) {
    if (cpi->ppi->seq_params_locked == 0) {
      pSVar2 = (cpi->common).seq_params;
      BVar4 = av1_select_sb_size(&cpi->oxcf,(cpi->common).width,(cpi->common).height,
                                 cpi->ppi->number_spatial_layers);
      pSVar2->sb_size = BVar4;
      pSVar2->mib_size =
           (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar4]
      ;
      pSVar2->mib_size_log2 = (uint)""[BVar4];
    }
  }
  else {
    uVar1 = (cpi->common).features.primary_ref_frame;
    if (((uVar1 & 0xf8) == 0 && uVar1 != 7) &&
       ((lVar5 = (long)(cpi->common).remapped_ref_idx[uVar1 & 7], lVar5 != -1 &&
        (pRVar6 = (cpi->common).ref_frame_map[lVar5], pRVar6 != (RefCntBuffer *)0x0)))) {
      memcpy((cpi->common).fc,&pRVar6->frame_context,0x52fc);
    }
    else {
      av1_setup_past_independence(cm);
      (cpi->common).seg.update_map = '\x01';
      (cpi->common).seg.update_data = '\x01';
    }
  }
  pRVar6 = (cpi->common).cur_frame;
  pRVar6->interp_filter_selected[0] = 0;
  pRVar6->interp_filter_selected[1] = 0;
  pRVar6->interp_filter_selected[2] = 0;
  pRVar6->interp_filter_selected[3] = 0;
  uVar1 = (cpi->common).features.primary_ref_frame;
  if (((uVar1 & 0xf8) == 0 && uVar1 != 7) &&
     (lVar5 = (long)(cpi->common).remapped_ref_idx[uVar1 & 7], lVar5 != -1)) {
    pRVar6 = (cpi->common).ref_frame_map[lVar5];
  }
  else {
    pRVar6 = (RefCntBuffer *)0x0;
  }
  (cpi->common).prev_frame = pRVar6;
  cpi->vaq_refresh = 0;
  return;
}

Assistant:

void av1_setup_frame(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  // Set up entropy context depending on frame type. The decoder mandates
  // the use of the default context, index 0, for keyframes and inter
  // frames where the error_resilient_mode or intra_only flag is set. For
  // other inter-frames the encoder currently uses only two contexts;
  // context 1 for ALTREF frames and context 0 for the others.

  if (frame_is_intra_only(cm) || cm->features.error_resilient_mode ||
      cpi->ext_flags.use_primary_ref_none) {
    av1_setup_past_independence(cm);
  }

  if ((cm->current_frame.frame_type == KEY_FRAME && cm->show_frame) ||
      frame_is_sframe(cm)) {
    if (!cpi->ppi->seq_params_locked) {
      set_sb_size(cm->seq_params,
                  av1_select_sb_size(&cpi->oxcf, cm->width, cm->height,
                                     cpi->ppi->number_spatial_layers));
    }
  } else {
    const RefCntBuffer *const primary_ref_buf = get_primary_ref_frame_buf(cm);
    if (primary_ref_buf == NULL) {
      av1_setup_past_independence(cm);
      cm->seg.update_map = 1;
      cm->seg.update_data = 1;
    } else {
      *cm->fc = primary_ref_buf->frame_context;
    }
  }

  av1_zero(cm->cur_frame->interp_filter_selected);
  cm->prev_frame = get_primary_ref_frame_buf(cm);
  cpi->vaq_refresh = 0;
}